

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

bool s2shapeutil::VisitCrossings
               (S2ShapeIndex *index,CrossingType type,bool need_adjacent,EdgePairVisitor *visitor)

{
  bool bVar1;
  S2ShapeIndexCell *cell;
  int local_3c8;
  Iterator local_3b8;
  Iterator it;
  ShapeEdgeVector shape_edges;
  EdgePairVisitor *visitor_local;
  bool need_adjacent_local;
  CrossingType type_local;
  S2ShapeIndex *index_local;
  
  absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
  InlinedVector((InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                 *)&it);
  S2ShapeIndex::Iterator::Iterator(&local_3b8,index,BEGIN);
  do {
    bVar1 = S2ShapeIndex::Iterator::done(&local_3b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_3c8 = 2;
LAB_00509eb7:
      S2ShapeIndex::Iterator::~Iterator(&local_3b8);
      if (local_3c8 == 2) {
        index_local._7_1_ = 1;
      }
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      ~InlinedVector((InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                      *)&it);
      return (bool)(index_local._7_1_ & 1);
    }
    cell = S2ShapeIndex::Iterator::cell(&local_3b8);
    GetShapeEdges(index,cell,(ShapeEdgeVector *)&it);
    bVar1 = VisitCrossings((ShapeEdgeVector *)&it,type,need_adjacent,visitor);
    if (!bVar1) {
      index_local._7_1_ = 0;
      local_3c8 = 1;
      goto LAB_00509eb7;
    }
    S2ShapeIndex::Iterator::Next(&local_3b8);
  } while( true );
}

Assistant:

static bool VisitCrossings(
    const S2ShapeIndex& index, CrossingType type, bool need_adjacent,
    const EdgePairVisitor& visitor) {
  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  ShapeEdgeVector shape_edges;
  for (S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
       !it.done(); it.Next()) {
    GetShapeEdges(index, it.cell(), &shape_edges);
    if (!VisitCrossings(shape_edges, type, need_adjacent, visitor)) {
      return false;
    }
  }
  return true;
}